

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RobSubstitution.cpp
# Opt level: O0

SubstIterator __thiscall
Kernel::RobSubstitution::getAssocIterator<Kernel::RobSubstitution::MatchingFn>
          (RobSubstitution *this,RobSubstitution *subst,Literal *l1,int l1Index,Literal *l2,
          int l2Index,bool complementary)

{
  AssocContext<Kernel::RobSubstitution::MatchingFn> context;
  bool bVar1;
  undefined1 uVar2;
  Literal *l1_00;
  AssocIterator<Kernel::RobSubstitution::MatchingFn> *in_RDI;
  SingletonIterator<Kernel::RobSubstitution_*> SVar3;
  IteratorCore<Kernel::RobSubstitution_*> *in_stack_fffffffffffffee8;
  Literal *in_stack_fffffffffffffef0;
  int l1Index_00;
  Literal *in_stack_fffffffffffffef8;
  AssocContext<Kernel::RobSubstitution::MatchingFn> *in_stack_ffffffffffffff00;
  undefined8 in_stack_ffffffffffffff08;
  int l1Index_01;
  RobSubstitution *in_stack_ffffffffffffff18;
  AssocIterator<Kernel::RobSubstitution::MatchingFn> *this_00;
  undefined8 uStack_b8;
  undefined8 in_stack_ffffffffffffff50;
  RobSubstitution *in_stack_ffffffffffffff58;
  undefined7 in_stack_ffffffffffffff69;
  undefined1 in_stack_ffffffffffffff78 [32];
  
  l1Index_01 = (int)((ulong)in_stack_ffffffffffffff08 >> 0x20);
  this_00 = in_RDI;
  bVar1 = Literal::headersMatch
                    (in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
                     SUB81((ulong)in_stack_fffffffffffffee8 >> 0x38,0));
  l1Index_00 = (int)((ulong)in_stack_fffffffffffffef0 >> 0x20);
  if (bVar1) {
    bVar1 = Literal::isEquality((Literal *)0x96154d);
    if (bVar1) {
      l1_00 = (Literal *)::operator_new(0x50);
      AssocIterator<Kernel::RobSubstitution::MatchingFn>::AssocIterator
                (this_00,in_stack_ffffffffffffff18,l1_00,l1Index_01,
                 (Literal *)in_stack_ffffffffffffff00,
                 (int)((ulong)in_stack_fffffffffffffef8 >> 0x20));
      Lib::vi<Kernel::RobSubstitution*>(in_stack_fffffffffffffee8);
    }
    else {
      SVar3 = Lib::getSingletonIterator<Kernel::RobSubstitution*>((RobSubstitution *)0x961562);
      SVar3._el = SVar3._el;
      uVar2 = SVar3._finished;
      AssocContext<Kernel::RobSubstitution::MatchingFn>::AssocContext
                (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,l1Index_00,
                 (Literal *)in_stack_fffffffffffffee8,0);
      SVar3._el = in_stack_ffffffffffffff58;
      SVar3._0_8_ = in_stack_ffffffffffffff50;
      context._l1i = in_stack_ffffffffffffff78._0_4_;
      context._12_4_ = in_stack_ffffffffffffff78._4_4_;
      context._l2 = (Literal *)in_stack_ffffffffffffff78._8_8_;
      context._l2i = in_stack_ffffffffffffff78._16_4_;
      context._28_4_ = in_stack_ffffffffffffff78._20_4_;
      context._bdata._boList = (BacktrackObject *)in_stack_ffffffffffffff78._24_8_;
      context._l1 = (Literal *)SVar3._el;
      Lib::
      getContextualIterator<Lib::SingletonIterator<Kernel::RobSubstitution*>,Kernel::RobSubstitution::AssocContext<Kernel::RobSubstitution::MatchingFn>>
                (SVar3,context);
      Lib::
      pvi<Lib::ContextualIterator<Lib::SingletonIterator<Kernel::RobSubstitution*>,Kernel::RobSubstitution::AssocContext<Kernel::RobSubstitution::MatchingFn>>>
                ((ContextualIterator<Lib::SingletonIterator<Kernel::RobSubstitution_*>,_Kernel::RobSubstitution::AssocContext<Kernel::RobSubstitution::MatchingFn>_>
                  *)CONCAT71(in_stack_ffffffffffffff69,uVar2));
      Lib::
      ContextualIterator<Lib::SingletonIterator<Kernel::RobSubstitution_*>,_Kernel::RobSubstitution::AssocContext<Kernel::RobSubstitution::MatchingFn>_>
      ::~ContextualIterator(uStack_b8);
    }
  }
  else {
    Lib::VirtualIterator<Kernel::RobSubstitution_*>::getEmpty();
  }
  return (SubstIterator)&in_RDI->super_IteratorCore<Kernel::RobSubstitution_*>;
}

Assistant:

SubstIterator RobSubstitution::getAssocIterator(RobSubstitution* subst,
	  Literal* l1, int l1Index, Literal* l2, int l2Index, bool complementary)
{
  if( !Literal::headersMatch(l1,l2,complementary) ) {
    return SubstIterator::getEmpty();
  }

  if( !l1->isEquality() ) {
    return pvi( getContextualIterator(getSingletonIterator(subst),
	    AssocContext<Fn>(l1, l1Index, l2, l2Index)) );
  } else {
    return vi(
	    new AssocIterator<Fn>(subst, l1, l1Index, l2, l2Index));
  }
}